

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

void __thiscall tinyobj::MaterialFileReader::~MaterialFileReader(MaterialFileReader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_MaterialReader)._vptr_MaterialReader =
       (_func_int **)&PTR__MaterialFileReader_001a2618;
  pcVar2 = (this->m_mtlBaseDir)._M_dataplus._M_p;
  paVar1 = &(this->m_mtlBaseDir).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~MaterialFileReader() {}